

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_binder.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::CheckBinder::BindCheckColumn
          (BindResult *__return_storage_ptr__,CheckBinder *this,ColumnRefExpression *colref)

{
  optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> *this_00;
  ColumnList *pCVar1;
  pointer pcVar2;
  bool bVar3;
  reference this_01;
  NotImplementedException *this_02;
  reference pvVar4;
  ColumnDefinition *this_03;
  ParsedExpression *pPVar5;
  LogicalType *other;
  storage_t *psVar6;
  BoundReferenceExpression *pBVar7;
  BinderException *this_04;
  __hashtable *__h;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var8;
  BindResult *this_05;
  size_type __n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_06;
  __node_gen_type __node_gen;
  string local_88;
  BindResult *local_68;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_60;
  idx_t local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68 = __return_storage_ptr__;
  bVar3 = ColumnRefExpression::IsQualified(colref);
  if ((!bVar3) &&
     ((this->super_ExpressionBinder).lambda_bindings.ptr !=
      (vector<duckdb::DummyBinding,_true> *)0x0)) {
    this_00 = &(this->super_ExpressionBinder).lambda_bindings;
    optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true>::CheckValid(this_00);
    __n = ((long)(this_00->ptr->
                 super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
                 super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this_00->ptr->
                 super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
                 super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * 0xf83e0f83e0f83e1;
    while (__n = __n - 1, __n != 0xffffffffffffffff) {
      optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true>::CheckValid(this_00);
      this_01 = vector<duckdb::DummyBinding,_true>::operator[](this_00->ptr,__n);
      (*(colref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
                (&local_88,colref);
      bVar3 = Binding::HasMatchingBinding(&this_01->super_Binding,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if (bVar3) {
        this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,
                   "Lambda functions are currently not supported in CHECK constraints.","");
        NotImplementedException::NotImplementedException(this_02,(string *)&local_88);
        __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
    }
  }
  this_05 = local_68;
  if ((ulong)((long)(colref->column_names).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(colref->column_names).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    this_06 = &colref->column_names;
    pCVar1 = this->columns;
    pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](this_06,0);
    bVar3 = ColumnList::ColumnExists(pCVar1,pvVar4);
    this_05 = local_68;
    if (!bVar3) {
      this_04 = (BinderException *)__cxa_allocate_exception(0x10);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,
                 "Table does not contain column %s referenced in check constraint!","");
      pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](this_06,0);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar2 = (pvVar4->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + pvVar4->_M_string_length);
      BinderException::BinderException<std::__cxx11::string>(this_04,&local_88,&local_50);
      __cxa_throw(this_04,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar1 = this->columns;
    pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](this_06,0);
    this_03 = ColumnList::GetColumn(pCVar1,pvVar4);
    bVar3 = ColumnDefinition::Generated(this_03);
    if (bVar3) {
      pPVar5 = ColumnDefinition::GeneratedExpression(this_03);
      (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_88,pPVar5);
      (*(this->super_ExpressionBinder)._vptr_ExpressionBinder[5])(this_05,this,&local_88,0,0);
      _Var8._M_head_impl = (Expression *)local_88._M_dataplus._M_p;
    }
    else {
      pBVar7 = (BoundReferenceExpression *)this->bound_columns;
      local_58 = (idx_t)ColumnDefinition::Physical(this_03);
      local_88._M_dataplus._M_p = (pointer)pBVar7;
      ::std::
      _Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::PhysicalIndex,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::PhysicalIndex,true>>>>
                ((_Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)pBVar7);
      other = ColumnDefinition::Type(this_03);
      psVar6 = ColumnDefinition::StorageOid(this_03);
      pBVar7 = (BoundReferenceExpression *)operator_new(0x60);
      LogicalType::LogicalType((LogicalType *)&local_88,other);
      BoundReferenceExpression::BoundReferenceExpression(pBVar7,(LogicalType *)&local_88,*psVar6);
      LogicalType::~LogicalType((LogicalType *)&local_88);
      local_60._M_head_impl = (Expression *)pBVar7;
      BindResult::BindResult
                (this_05,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&local_60);
      _Var8._M_head_impl = local_60._M_head_impl;
    }
    if ((BoundReferenceExpression *)_Var8._M_head_impl != (BoundReferenceExpression *)0x0) {
      (*(((Expression *)&(_Var8._M_head_impl)->super_BaseExpression)->super_BaseExpression).
        _vptr_BaseExpression[1])();
    }
  }
  else {
    ExpressionBinder::BindQualifiedColumnName
              (local_68,&this->super_ExpressionBinder,colref,&this->table);
  }
  return this_05;
}

Assistant:

BindResult CheckBinder::BindCheckColumn(ColumnRefExpression &colref) {

	if (!colref.IsQualified()) {
		if (lambda_bindings) {
			for (idx_t i = lambda_bindings->size(); i > 0; i--) {
				if ((*lambda_bindings)[i - 1].HasMatchingBinding(colref.GetName())) {
					// FIXME: support lambdas in CHECK constraints
					// FIXME: like so: return (*lambda_bindings)[i - 1].Bind(colref, i, depth);
					// FIXME: and move this to LambdaRefExpression::FindMatchingBinding
					throw NotImplementedException("Lambda functions are currently not supported in CHECK constraints.");
				}
			}
		}
	}

	if (colref.column_names.size() > 1) {
		return BindQualifiedColumnName(colref, table);
	}
	if (!columns.ColumnExists(colref.column_names[0])) {
		throw BinderException("Table does not contain column %s referenced in check constraint!",
		                      colref.column_names[0]);
	}
	auto &col = columns.GetColumn(colref.column_names[0]);
	if (col.Generated()) {
		auto bound_expression = col.GeneratedExpression().Copy();
		return BindExpression(bound_expression, 0, false);
	}
	bound_columns.insert(col.Physical());
	D_ASSERT(col.StorageOid() != DConstants::INVALID_INDEX);
	return BindResult(make_uniq<BoundReferenceExpression>(col.Type(), col.StorageOid()));
}